

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void HFilter8i_SSE2(uint8_t *u,uint8_t *v,int stride,int thresh,int ithresh,int hev_thresh)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long in_RDI;
  byte bVar20;
  ulong uVar21;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  undefined1 auVar22 [16];
  byte bVar30;
  undefined1 auVar23 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i t2;
  __m128i t1;
  __m128i mask;
  undefined8 local_378;
  __m128i *in_stack_fffffffffffffc90;
  __m128i *in_stack_fffffffffffffc98;
  __m128i *in_stack_fffffffffffffca0;
  undefined4 local_358;
  int in_stack_fffffffffffffcac;
  uint8_t *in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  __m128i *in_stack_fffffffffffffcc0;
  __m128i *in_stack_fffffffffffffcc8;
  __m128i *in_stack_fffffffffffffcd0;
  __m128i *in_stack_fffffffffffffcd8;
  __m128i *in_stack_fffffffffffffce0;
  undefined8 uVar34;
  __m128i *p1_00;
  int hev_thresh_00;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  int stride_00;
  undefined4 uStack_1fc;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined1 local_68;
  undefined1 uStack_67;
  undefined1 uStack_66;
  undefined1 uStack_65;
  undefined1 uStack_64;
  undefined1 uStack_63;
  undefined1 uStack_62;
  undefined1 uStack_61;
  undefined1 local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined1 uStack_52;
  undefined1 uStack_51;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 local_28;
  undefined1 uStack_27;
  undefined1 uStack_26;
  undefined1 uStack_25;
  undefined1 uStack_24;
  undefined1 uStack_23;
  undefined1 uStack_22;
  undefined1 uStack_21;
  undefined1 local_18;
  undefined1 uStack_17;
  undefined1 uStack_16;
  undefined1 uStack_15;
  undefined1 uStack_14;
  undefined1 uStack_13;
  undefined1 uStack_12;
  undefined1 uStack_11;
  
  Load16x4_SSE2((uint8_t *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca0,
                in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,local_2b8);
  auVar19._4_4_ = in_stack_fffffffffffffcac;
  auVar19._0_4_ = local_358;
  auVar18._4_4_ = in_stack_fffffffffffffcbc;
  auVar18._0_4_ = in_stack_fffffffffffffcb8;
  auVar19._8_8_ = in_stack_fffffffffffffcb0;
  auVar18._8_8_ = in_stack_fffffffffffffcc0;
  auVar31 = psubusb(auVar19,auVar18);
  auVar17._4_4_ = in_stack_fffffffffffffcbc;
  auVar17._0_4_ = in_stack_fffffffffffffcb8;
  auVar16._4_4_ = in_stack_fffffffffffffcac;
  auVar16._0_4_ = local_358;
  auVar17._8_8_ = in_stack_fffffffffffffcc0;
  auVar16._8_8_ = in_stack_fffffffffffffcb0;
  auVar22 = psubusb(auVar17,auVar16);
  local_238 = auVar31._0_8_;
  local_248 = auVar22._0_8_;
  local_238 = local_238 | local_248;
  auVar15._8_8_ = in_stack_fffffffffffffce0;
  auVar15._0_8_ = in_stack_fffffffffffffcd8;
  auVar14._8_8_ = in_stack_fffffffffffffcd0;
  auVar14._0_8_ = in_stack_fffffffffffffcc8;
  auVar31 = psubusb(auVar15,auVar14);
  auVar13._8_8_ = in_stack_fffffffffffffcd0;
  auVar13._0_8_ = in_stack_fffffffffffffcc8;
  auVar12._8_8_ = in_stack_fffffffffffffce0;
  auVar12._0_8_ = in_stack_fffffffffffffcd8;
  auVar22 = psubusb(auVar13,auVar12);
  local_258 = auVar31._0_8_;
  local_268 = auVar22._0_8_;
  local_258 = local_258 | local_268;
  local_18 = (byte)local_238;
  uStack_17 = (byte)(local_238 >> 8);
  uStack_16 = (byte)(local_238 >> 0x10);
  uStack_15 = (byte)(local_238 >> 0x18);
  uStack_14 = (byte)(local_238 >> 0x20);
  uStack_13 = (byte)(local_238 >> 0x28);
  uStack_12 = (byte)(local_238 >> 0x30);
  uStack_11 = (byte)(local_238 >> 0x38);
  local_28 = (byte)local_258;
  uStack_27 = (byte)(local_258 >> 8);
  uStack_26 = (byte)(local_258 >> 0x10);
  uStack_25 = (byte)(local_258 >> 0x18);
  uStack_24 = (byte)(local_258 >> 0x20);
  uStack_23 = (byte)(local_258 >> 0x28);
  uStack_22 = (byte)(local_258 >> 0x30);
  uStack_21 = (byte)(local_258 >> 0x38);
  bVar20 = (local_18 < local_28) * local_28 | (local_18 >= local_28) * local_18;
  bVar24 = (uStack_17 < uStack_27) * uStack_27 | (uStack_17 >= uStack_27) * uStack_17;
  bVar25 = (uStack_16 < uStack_26) * uStack_26 | (uStack_16 >= uStack_26) * uStack_16;
  bVar26 = (uStack_15 < uStack_25) * uStack_25 | (uStack_15 >= uStack_25) * uStack_15;
  bVar27 = (uStack_14 < uStack_24) * uStack_24 | (uStack_14 >= uStack_24) * uStack_14;
  bVar28 = (uStack_13 < uStack_23) * uStack_23 | (uStack_13 >= uStack_23) * uStack_13;
  bVar29 = (uStack_12 < uStack_22) * uStack_22 | (uStack_12 >= uStack_22) * uStack_12;
  bVar30 = (uStack_11 < uStack_21) * uStack_21 | (uStack_11 >= uStack_21) * uStack_11;
  auVar11._4_4_ = in_stack_fffffffffffffcbc;
  auVar11._0_4_ = in_stack_fffffffffffffcb8;
  auVar11._8_8_ = in_stack_fffffffffffffcc0;
  auVar32._8_8_ = in_stack_fffffffffffffce0;
  auVar32._0_8_ = in_stack_fffffffffffffcd8;
  auVar32 = psubusb(auVar11,auVar32);
  auVar9._4_4_ = in_stack_fffffffffffffcbc;
  auVar9._0_4_ = in_stack_fffffffffffffcb8;
  auVar10._8_8_ = in_stack_fffffffffffffce0;
  auVar10._0_8_ = in_stack_fffffffffffffcd8;
  auVar9._8_8_ = in_stack_fffffffffffffcc0;
  auVar22 = psubusb(auVar10,auVar9);
  local_278 = auVar32._0_8_;
  local_288 = auVar22._0_8_;
  local_278 = local_278 | local_288;
  local_48 = (byte)local_278;
  uStack_47 = (byte)(local_278 >> 8);
  uStack_46 = (byte)(local_278 >> 0x10);
  uStack_45 = (byte)(local_278 >> 0x18);
  uStack_44 = (byte)(local_278 >> 0x20);
  uStack_43 = (byte)(local_278 >> 0x28);
  uStack_42 = (byte)(local_278 >> 0x30);
  uStack_41 = (byte)(local_278 >> 0x38);
  uVar34 = CONCAT17((bVar30 < uStack_41) * uStack_41 | (bVar30 >= uStack_41) * bVar30,
                    CONCAT16((bVar29 < uStack_42) * uStack_42 | (bVar29 >= uStack_42) * bVar29,
                             CONCAT15((bVar28 < uStack_43) * uStack_43 |
                                      (bVar28 >= uStack_43) * bVar28,
                                      CONCAT14((bVar27 < uStack_44) * uStack_44 |
                                               (bVar27 >= uStack_44) * bVar27,
                                               CONCAT13((bVar26 < uStack_45) * uStack_45 |
                                                        (bVar26 >= uStack_45) * bVar26,
                                                        CONCAT12((bVar25 < uStack_46) * uStack_46 |
                                                                 (bVar25 >= uStack_46) * bVar25,
                                                                 CONCAT11((bVar24 < uStack_47) *
                                                                          uStack_47 |
                                                                          (bVar24 >= uStack_47) *
                                                                          bVar24,(bVar20 < local_48)
                                                                                 * local_48 |
                                                                                 (bVar20 >= local_48
                                                                                 ) * bVar20)))))));
  hev_thresh_00 = (int)((ulong)(in_RDI + 4) >> 0x20);
  Load16x4_SSE2((uint8_t *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca0,
                in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,local_2b8);
  auVar8._8_8_ = in_stack_fffffffffffffca0;
  auVar8._0_8_ = in_stack_fffffffffffffc98;
  auVar7._8_8_ = in_stack_fffffffffffffc90;
  auVar7._0_8_ = local_378;
  auVar31 = psubusb(auVar8,auVar7);
  auVar6._8_8_ = in_stack_fffffffffffffc90;
  auVar6._0_8_ = local_378;
  auVar5._8_8_ = in_stack_fffffffffffffca0;
  auVar5._0_8_ = in_stack_fffffffffffffc98;
  auVar22 = psubusb(auVar6,auVar5);
  local_298 = auVar31._0_8_;
  local_2a8 = auVar22._0_8_;
  local_298 = local_298 | local_2a8;
  local_58 = (byte)uVar34;
  uStack_57 = (byte)((ulong)uVar34 >> 8);
  uStack_56 = (byte)((ulong)uVar34 >> 0x10);
  uStack_55 = (byte)((ulong)uVar34 >> 0x18);
  uStack_54 = (byte)((ulong)uVar34 >> 0x20);
  uStack_53 = (byte)((ulong)uVar34 >> 0x28);
  uStack_52 = (byte)((ulong)uVar34 >> 0x30);
  uStack_51 = (byte)((ulong)uVar34 >> 0x38);
  local_68 = (byte)local_298;
  uStack_67 = (byte)(local_298 >> 8);
  uStack_66 = (byte)(local_298 >> 0x10);
  uStack_65 = (byte)(local_298 >> 0x18);
  uStack_64 = (byte)(local_298 >> 0x20);
  uStack_63 = (byte)(local_298 >> 0x28);
  uStack_62 = (byte)(local_298 >> 0x30);
  uStack_61 = (byte)(local_298 >> 0x38);
  bVar20 = (local_58 < local_68) * local_68 | (local_58 >= local_68) * local_58;
  bVar24 = (uStack_57 < uStack_67) * uStack_67 | (uStack_57 >= uStack_67) * uStack_57;
  bVar25 = (uStack_56 < uStack_66) * uStack_66 | (uStack_56 >= uStack_66) * uStack_56;
  bVar26 = (uStack_55 < uStack_65) * uStack_65 | (uStack_55 >= uStack_65) * uStack_55;
  bVar27 = (uStack_54 < uStack_64) * uStack_64 | (uStack_54 >= uStack_64) * uStack_54;
  bVar28 = (uStack_53 < uStack_63) * uStack_63 | (uStack_53 >= uStack_63) * uStack_53;
  bVar29 = (uStack_52 < uStack_62) * uStack_62 | (uStack_52 >= uStack_62) * uStack_52;
  bVar30 = (uStack_51 < uStack_61) * uStack_61 | (uStack_51 >= uStack_61) * uStack_51;
  auVar4._8_8_ = in_stack_fffffffffffffce0;
  auVar4._0_8_ = in_stack_fffffffffffffcd8;
  auVar3._8_8_ = in_stack_fffffffffffffcd0;
  auVar3._0_8_ = in_stack_fffffffffffffcc8;
  auVar22 = psubusb(auVar4,auVar3);
  auVar2._8_8_ = in_stack_fffffffffffffcd0;
  auVar2._0_8_ = in_stack_fffffffffffffcc8;
  auVar23._8_8_ = in_stack_fffffffffffffce0;
  auVar23._0_8_ = in_stack_fffffffffffffcd8;
  auVar23 = psubusb(auVar2,auVar23);
  local_2b8 = auVar22._0_8_;
  uVar21 = (ulong)local_2b8 | (ulong)auVar23._0_8_;
  local_88 = (byte)uVar21;
  uStack_87 = (byte)(uVar21 >> 8);
  uStack_86 = (byte)(uVar21 >> 0x10);
  uStack_85 = (byte)(uVar21 >> 0x18);
  uStack_84 = (byte)(uVar21 >> 0x20);
  uStack_83 = (byte)(uVar21 >> 0x28);
  uStack_82 = (byte)(uVar21 >> 0x30);
  uStack_81 = (byte)(uVar21 >> 0x38);
  bVar20 = (bVar20 < local_88) * local_88 | (bVar20 >= local_88) * bVar20;
  bVar24 = (bVar24 < uStack_87) * uStack_87 | (bVar24 >= uStack_87) * bVar24;
  bVar25 = (bVar25 < uStack_86) * uStack_86 | (bVar25 >= uStack_86) * bVar25;
  bVar26 = (bVar26 < uStack_85) * uStack_85 | (bVar26 >= uStack_85) * bVar26;
  bVar27 = (bVar27 < uStack_84) * uStack_84 | (bVar27 >= uStack_84) * bVar27;
  bVar28 = (bVar28 < uStack_83) * uStack_83 | (bVar28 >= uStack_83) * bVar28;
  bVar29 = (bVar29 < uStack_82) * uStack_82 | (bVar29 >= uStack_82) * bVar29;
  bVar30 = (bVar30 < uStack_81) * uStack_81 | (bVar30 >= uStack_81) * bVar30;
  stride_00 = (int)in_stack_fffffffffffffce0;
  uStack_1fc = (undefined4)((ulong)in_stack_fffffffffffffce0 >> 0x20);
  auVar1._8_8_ = in_stack_fffffffffffffc90;
  auVar1._0_8_ = local_378;
  auVar33._8_4_ = stride_00;
  auVar33._0_8_ = in_stack_fffffffffffffcd8;
  auVar33._12_4_ = uStack_1fc;
  auVar33 = psubusb(auVar1,auVar33);
  auVar31._8_8_ = in_stack_fffffffffffffce0;
  auVar31._0_8_ = in_stack_fffffffffffffcd8;
  auVar22._8_8_ = in_stack_fffffffffffffc90;
  auVar22._0_8_ = local_378;
  auVar22 = psubusb(auVar31,auVar22);
  uVar21 = auVar33._0_8_ | auVar22._0_8_;
  local_a8 = (byte)uVar21;
  uStack_a7 = (byte)(uVar21 >> 8);
  uStack_a6 = (byte)(uVar21 >> 0x10);
  uStack_a5 = (byte)(uVar21 >> 0x18);
  uStack_a4 = (byte)(uVar21 >> 0x20);
  uStack_a3 = (byte)(uVar21 >> 0x28);
  uStack_a2 = (byte)(uVar21 >> 0x30);
  uStack_a1 = (byte)(uVar21 >> 0x38);
  p1_00 = (__m128i *)
          CONCAT17((bVar30 < uStack_a1) * uStack_a1 | (bVar30 >= uStack_a1) * bVar30,
                   CONCAT16((bVar29 < uStack_a2) * uStack_a2 | (bVar29 >= uStack_a2) * bVar29,
                            CONCAT15((bVar28 < uStack_a3) * uStack_a3 |
                                     (bVar28 >= uStack_a3) * bVar28,
                                     CONCAT14((bVar27 < uStack_a4) * uStack_a4 |
                                              (bVar27 >= uStack_a4) * bVar27,
                                              CONCAT13((bVar26 < uStack_a5) * uStack_a5 |
                                                       (bVar26 >= uStack_a5) * bVar26,
                                                       CONCAT12((bVar25 < uStack_a6) * uStack_a6 |
                                                                (bVar25 >= uStack_a6) * bVar25,
                                                                CONCAT11((bVar24 < uStack_a7) *
                                                                         uStack_a7 |
                                                                         (bVar24 >= uStack_a7) *
                                                                         bVar24,(bVar20 < local_a8)
                                                                                * local_a8 |
                                                                                (bVar20 >= local_a8)
                                                                                * bVar20)))))));
  ComplexMask_SSE2(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                   in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8,
                   auVar32._8_8_);
  DoFilter4_SSE2(auVar23._0_8_,auVar33._8_8_,auVar33._0_8_,auVar22._8_8_,auVar22._0_8_,hev_thresh_00
                );
  Store16x4_SSE2(p1_00,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0
                 ,(uint8_t *)in_stack_fffffffffffffcc8,(uint8_t *)in_stack_fffffffffffffcc0,
                 stride_00);
  return;
}

Assistant:

static void HFilter8i_SSE2(uint8_t* WEBP_RESTRICT u, uint8_t* WEBP_RESTRICT v,
                           int stride,
                           int thresh, int ithresh, int hev_thresh) {
  __m128i mask;
  __m128i t1, t2, p1, p0, q0, q1;
  Load16x4_SSE2(u, v, stride, &t2, &t1, &p1, &p0);   // p3, p2, p1, p0
  MAX_DIFF1(t2, t1, p1, p0, mask);

  u += 4;  // beginning of q0
  v += 4;
  Load16x4_SSE2(u, v, stride, &q0, &q1, &t1, &t2);  // q0, q1, q2, q3
  MAX_DIFF2(t2, t1, q1, q0, mask);

  ComplexMask_SSE2(&p1, &p0, &q0, &q1, thresh, ithresh, &mask);
  DoFilter4_SSE2(&p1, &p0, &q0, &q1, &mask, hev_thresh);

  u -= 2;  // beginning of p1
  v -= 2;
  Store16x4_SSE2(&p1, &p0, &q0, &q1, u, v, stride);
}